

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_freeDCtx(ZSTD_DCtx *dctx)

{
  ZSTD_customMem *pZVar1;
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  ZSTD_customMem customMem_01;
  ZSTD_customMem cMem;
  ZSTD_DCtx *dctx_local;
  
  if (dctx == (ZSTD_DCtx *)0x0) {
    dctx_local = (ZSTD_DCtx *)0x0;
  }
  else if (dctx->staticSize == 0) {
    pZVar1 = &dctx->customMem;
    customMem_01 = *pZVar1;
    customMem_00 = *pZVar1;
    customMem = *pZVar1;
    ZSTD_clearDict(dctx);
    ZSTD_customFree(dctx->inBuff,customMem);
    dctx->inBuff = (char *)0x0;
    if (dctx->ddictSet != (ZSTD_DDictHashSet *)0x0) {
      ZSTD_freeDDictHashSet(dctx->ddictSet,customMem_00);
      dctx->ddictSet = (ZSTD_DDictHashSet *)0x0;
    }
    ZSTD_customFree(dctx,customMem_01);
    dctx_local = (ZSTD_DCtx *)0x0;
  }
  else {
    dctx_local = (ZSTD_DCtx *)0xffffffffffffffc0;
  }
  return (size_t)dctx_local;
}

Assistant:

size_t ZSTD_freeDCtx(ZSTD_DCtx* dctx)
{
    if (dctx==NULL) return 0;   /* support free on NULL */
    RETURN_ERROR_IF(dctx->staticSize, memory_allocation, "not compatible with static DCtx");
    {   ZSTD_customMem const cMem = dctx->customMem;
        ZSTD_clearDict(dctx);
        ZSTD_customFree(dctx->inBuff, cMem);
        dctx->inBuff = NULL;
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (dctx->legacyContext)
            ZSTD_freeLegacyStreamContext(dctx->legacyContext, dctx->previousLegacyVersion);
#endif
        if (dctx->ddictSet) {
            ZSTD_freeDDictHashSet(dctx->ddictSet, cMem);
            dctx->ddictSet = NULL;
        }
        ZSTD_customFree(dctx, cMem);
        return 0;
    }
}